

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Man_t * Aig_ManDupDfsGuided(Aig_Man_t *p,Vec_Ptr_t *vPios)

{
  uint uVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  Vec_Int_t *pVVar3;
  Aig_Obj_t **ppAVar4;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar5;
  Tim_Man_t *pTVar6;
  int iVar7;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  iVar7 = p->nConstrs;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = iVar7;
  p_00->nBarBufs = p->nBarBufs;
  if (p->vFlopNums != (Vec_Int_t *)0x0) {
    pVVar3 = Vec_IntDup(p->vFlopNums);
    p_00->vFlopNums = pVVar3;
  }
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    ppAVar4 = (Aig_Obj_t **)calloc(1,(long)p->vObjs->nSize << 3);
    p_00->pEquivs = ppAVar4;
  }
  if (p->pReprs != (Aig_Obj_t **)0x0) {
    ppAVar4 = (Aig_Obj_t **)calloc(1,(long)p->vObjs->nSize << 3);
    p_00->pReprs = ppAVar4;
  }
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  iVar7 = 0;
  do {
    if (vPios->nSize <= iVar7) {
      if ((p->pEquivs == (Aig_Obj_t **)0x0) && (p->pReprs == (Aig_Obj_t **)0x0)) {
        uVar1 = Aig_ManCleanup(p_00);
        if (uVar1 != 0) {
          printf("Aig_ManDupDfs(): Cleanup after AIG duplication removed %d nodes.\n",(ulong)uVar1);
        }
      }
      Aig_ManSetRegNum(p_00,p->nRegs);
      if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
        pTVar6 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
        p_00->pManTime = pTVar6;
      }
      iVar7 = Aig_ManCheck(p_00);
      if (iVar7 == 0) {
        puts("Aig_ManDupDfs(): The check has failed.");
      }
      return p_00;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(vPios,iVar7);
    uVar1 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
    if (uVar1 == 3) {
      Aig_ManDupDfsGuided_rec(p_00,p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      pAVar5 = Aig_ObjChild0Copy(pObj);
      pAVar5 = Aig_ObjCreateCo(p_00,pAVar5);
LAB_00575d6d:
      (pObj->field_5).pData = pAVar5;
    }
    else if (uVar1 == 2) {
      pAVar5 = Aig_ObjCreateCi(p_00);
      *(ulong *)&pAVar5->field_0x18 =
           *(ulong *)&pAVar5->field_0x18 & 0xff000000ffffffff |
           *(ulong *)&pObj->field_0x18 & 0xffffff00000000;
      goto LAB_00575d6d;
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Aig_ManDupDfsGuided( Aig_Man_t * p, Vec_Ptr_t * vPios )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew = NULL;
    int i, nNodes;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // duplicate representation of choice nodes
    if ( p->pEquivs )
    {
        pNew->pEquivs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
        memset( pNew->pEquivs, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p) );
    }
    if ( p->pReprs )
    {
        pNew->pReprs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
        memset( pNew->pReprs, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p) );
    }
    // create the PIs
    Aig_ManCleanData( p );
    // duplicate internal nodes
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, vPios, pObj, i )
    {
        if ( Aig_ObjIsCi(pObj) )
        {
            pObjNew = Aig_ObjCreateCi( pNew );
            pObjNew->Level = pObj->Level;
            pObj->pData = pObjNew;
        }
        else if ( Aig_ObjIsCo(pObj) )
        {
            Aig_ManDupDfsGuided_rec( pNew, p, Aig_ObjFanin0(pObj) );        
//            assert( pObj->Level == ((Aig_Obj_t*)pObj->pData)->Level );
            pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
            pObj->pData = pObjNew;
        }
    }
//    assert( Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
    if ( p->pEquivs == NULL && p->pReprs == NULL && (nNodes = Aig_ManCleanup( pNew )) )
        printf( "Aig_ManDupDfs(): Cleanup after AIG duplication removed %d nodes.\n", nNodes );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // duplicate the timing manager
    if ( p->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupDfs(): The check has failed.\n" );
    return pNew;
}